

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::Galactic2ICRS(CESkyCoord *in_galactic,CESkyCoord *out_icrs)

{
  long *in_RSI;
  CEAngle *in_RDI;
  CEDate *this;
  double date;
  double *angle;
  double dec;
  double ra;
  undefined8 in_stack_fffffffffffffee0;
  CEDateType date_format;
  double in_stack_fffffffffffffee8;
  CEDate *in_stack_fffffffffffffef0;
  undefined4 local_f4;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [64];
  CEAngle local_90 [2];
  undefined1 local_70 [64];
  CEAngle local_30;
  undefined8 local_20;
  undefined8 local_18;
  long *local_10;
  CEAngle *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  local_18 = 0;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,date_format);
  (*in_RDI->_vptr_CEAngle[3])(&local_30,in_RDI,local_70);
  this = (CEDate *)CEAngle::Rad(&local_30);
  date = CppEphem::julian_date_J2000();
  CEDate::CEDate(this,date,(CEDateType)((ulong)local_8 >> 0x20));
  (*local_8->_vptr_CEAngle[4])(local_90,local_8,local_d0);
  angle = (double *)CEAngle::Rad(local_90);
  iauG2icrs(this,angle,&local_18,&local_20);
  CEAngle::~CEAngle((CEAngle *)0x165377);
  CEDate::~CEDate((CEDate *)0x165381);
  CEAngle::~CEAngle((CEAngle *)0x16538e);
  CEDate::~CEDate((CEDate *)0x16539b);
  CEAngle::CEAngle(local_8,angle);
  CEAngle::CEAngle(local_8,angle);
  local_f4 = 1;
  (**(code **)(*local_10 + 0x28))(local_10,local_e0,local_f0,&local_f4);
  CEAngle::~CEAngle((CEAngle *)0x1653ff);
  CEAngle::~CEAngle((CEAngle *)0x165409);
  return;
}

Assistant:

void CESkyCoord::Galactic2ICRS(const CESkyCoord& in_galactic,
                               CESkyCoord*       out_icrs)
{
    // Do the Galactic -> ICRS converstion
    double ra(0.0);
    double dec(0.0);
    iauG2icrs(in_galactic.XCoord().Rad(), 
              in_galactic.YCoord().Rad(), 
              &ra, &dec);
    out_icrs->SetCoordinates(ra, dec, CESkyCoordType::ICRS);
    
    return;
}